

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvreader.cc
# Opt level: O2

int __thiscall mkvparser::MkvReader::Read(MkvReader *this,longlong offset,long len,uchar *buffer)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = -1;
  if (-1 < (len | offset) && (FILE *)this->m_file != (FILE *)0x0) {
    if (len == 0) {
      iVar2 = 0;
    }
    else if (offset < this->m_length) {
      fseeko((FILE *)this->m_file,offset,0);
      sVar1 = fread(buffer,1,len,(FILE *)this->m_file);
      iVar2 = -(uint)(sVar1 < (ulong)len);
    }
  }
  return iVar2;
}

Assistant:

int MkvReader::Read(long long offset, long len, unsigned char* buffer) {
  if (m_file == NULL)
    return -1;

  if (offset < 0)
    return -1;

  if (len < 0)
    return -1;

  if (len == 0)
    return 0;

  if (offset >= m_length)
    return -1;

#ifdef _MSC_VER
  const int status = _fseeki64(m_file, offset, SEEK_SET);

  if (status)
    return -1;  // error
#elif defined(_WIN32)
  fseeko64(m_file, static_cast<off_t>(offset), SEEK_SET);
#elif !(defined(__ANDROID__) && __ANDROID_API__ < 24 && !defined(__LP64__) && \
        defined(_FILE_OFFSET_BITS) && _FILE_OFFSET_BITS == 64)
  // POSIX.1 has fseeko and ftello. fseeko and ftello are not available before
  // Android API level 24. See
  // https://android.googlesource.com/platform/bionic/+/main/docs/32-bit-abi.md
  fseeko(m_file, static_cast<off_t>(offset), SEEK_SET);
#else
  fseek(m_file, static_cast<long>(offset), SEEK_SET);
#endif

  const size_t size = fread(buffer, 1, len, m_file);

  if (size < size_t(len))
    return -1;  // error

  return 0;  // success
}